

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

void cmsys::SystemTools::AddTranslationPath(string *a,string *b)

{
  pointer pcVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this;
  bool bVar2;
  int iVar3;
  long lVar4;
  string path_b;
  string path_a;
  string local_98;
  string local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  pcVar1 = (a->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar1,pcVar1 + a->_M_string_length)
  ;
  pcVar1 = (b->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar1,pcVar1 + b->_M_string_length)
  ;
  ConvertToUnixSlashes(&local_78);
  ConvertToUnixSlashes(&local_98);
  bVar2 = FileIsDirectory(&local_78);
  if ((((bVar2) && (local_98._M_string_length != 0)) &&
      ((*local_98._M_dataplus._M_p == '~' || (*local_98._M_dataplus._M_p == '/')))) &&
     (lVar4 = std::__cxx11::string::find((char *)&local_98,0x1d99c2,0), lVar4 == -1)) {
    if ((local_78._M_string_length != 0) &&
       (local_78._M_dataplus._M_p[local_78._M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&local_78);
    }
    if (local_98._M_string_length == 0) {
      if (local_78._M_string_length == 0) goto LAB_00149c1c;
    }
    else {
      if (local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/') {
        std::__cxx11::string::push_back((char)&local_98);
      }
      if ((local_78._M_string_length == local_98._M_string_length) &&
         ((local_98._M_string_length == 0 ||
          (iVar3 = bcmp(local_78._M_dataplus._M_p,local_98._M_dataplus._M_p,
                        local_98._M_string_length), iVar3 == 0)))) goto LAB_00149c1c;
    }
    this = TranslationMap;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_58,&local_78,&local_98);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
      operator_delete(local_58.second._M_dataplus._M_p,
                      local_58.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
      operator_delete(local_58.first._M_dataplus._M_p,
                      local_58.first.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00149c1c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a, const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if( SystemTools::FileIsDirectory( path_a ) )
    {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if( SystemTools::FileIsFullPath(path_b) && path_b.find("..")
        == std::string::npos )
      {
      // Before inserting make sure path ends with '/'
      if(!path_a.empty() && *path_a.rbegin() != '/')
        {
        path_a += '/';
        }
      if(!path_b.empty() && *path_b.rbegin() != '/')
        {
        path_b += '/';
        }
      if( !(path_a == path_b) )
        {
        SystemTools::TranslationMap->insert(
          SystemToolsTranslationMap::value_type(path_a, path_b));
        }
      }
    }
}